

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void fio_poll_add_read(intptr_t fd)

{
  intptr_t fd_local;
  
  fio_poll_add2((int)fd,0x40002011,evio_fd[1]);
  return;
}

Assistant:

static inline void fio_poll_add_read(intptr_t fd) {
  fio_poll_add2(fd, (EPOLLIN | EPOLLRDHUP | EPOLLHUP | EPOLLONESHOT),
                evio_fd[1]);
  return;
}